

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_info.cpp
# Opt level: O0

void __thiscall
NamesAndLabels::PopulateCallbackData
          (NamesAndLabels *this,XrDebugUtilsMessengerCallbackDataEXT *callback_data)

{
  bool bVar1;
  size_type sVar2;
  XrDebugUtilsLabelEXT *local_30;
  XrDebugUtilsObjectNameInfoEXT *local_28;
  XrDebugUtilsMessengerCallbackDataEXT *callback_data_local;
  NamesAndLabels *this_local;
  
  bVar1 = std::vector<XrDebugUtilsObjectNameInfoEXT,_std::allocator<XrDebugUtilsObjectNameInfoEXT>_>
          ::empty(&this->objects);
  if (bVar1) {
    local_28 = (XrDebugUtilsObjectNameInfoEXT *)0x0;
  }
  else {
    local_28 = std::
               vector<XrDebugUtilsObjectNameInfoEXT,_std::allocator<XrDebugUtilsObjectNameInfoEXT>_>
               ::data(&this->objects);
  }
  callback_data->objects = local_28;
  sVar2 = std::vector<XrDebugUtilsObjectNameInfoEXT,_std::allocator<XrDebugUtilsObjectNameInfoEXT>_>
          ::size(&this->objects);
  callback_data->objectCount = (uint32_t)sVar2;
  bVar1 = std::vector<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>::empty
                    (&this->labels);
  if (bVar1) {
    local_30 = (XrDebugUtilsLabelEXT *)0x0;
  }
  else {
    local_30 = std::vector<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>::data
                         (&this->labels);
  }
  callback_data->sessionLabels = local_30;
  sVar2 = std::vector<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>::size
                    (&this->labels);
  callback_data->sessionLabelCount = (uint32_t)sVar2;
  return;
}

Assistant:

void NamesAndLabels::PopulateCallbackData(XrDebugUtilsMessengerCallbackDataEXT& callback_data) const {
    callback_data.objects = objects.empty() ? nullptr : const_cast<XrDebugUtilsObjectNameInfoEXT*>(objects.data());
    callback_data.objectCount = static_cast<uint32_t>(objects.size());
    callback_data.sessionLabels = labels.empty() ? nullptr : const_cast<XrDebugUtilsLabelEXT*>(labels.data());
    callback_data.sessionLabelCount = static_cast<uint32_t>(labels.size());
}